

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestInstance::LineInterpolationTestInstance
          (LineInterpolationTestInstance *this,Context *context,
          VkPrimitiveTopology primitiveTopology,int flags,PrimitiveWideness wideness,
          VkSampleCountFlagBits sampleCount)

{
  VkPhysicalDeviceProperties *pVVar1;
  NotSupportedError *pNVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  value_type_conflict3 local_1ec;
  value_type_conflict3 local_1e8;
  undefined1 local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  MessageBuilder local_1c0;
  float *local_40;
  float *range;
  VkSampleCountFlagBits local_28;
  PrimitiveWideness local_24;
  VkSampleCountFlagBits sampleCount_local;
  PrimitiveWideness wideness_local;
  int flags_local;
  VkPrimitiveTopology primitiveTopology_local;
  Context *context_local;
  LineInterpolationTestInstance *this_local;
  
  local_28 = sampleCount;
  local_24 = wideness;
  sampleCount_local = flags;
  wideness_local = primitiveTopology;
  _flags_local = context;
  context_local = (Context *)this;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (&this->super_BaseRenderingTestInstance,context,sampleCount,0x100);
  (this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__LineInterpolationTestInstance_016b2b90;
  this->m_primitiveTopology = wideness_local;
  this->m_projective = SUB41((sampleCount_local & VK_SAMPLE_COUNT_2_BIT) >> 1,0);
  this->m_iterationCount = 3;
  this->m_primitiveWideness = local_24;
  this->m_iteration = 0;
  this->m_allIterationsPassed = true;
  this->m_maxLineWidth = 1.0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_lineWidths);
  this->m_flatshade = SUB41((sampleCount_local & VK_SAMPLE_COUNT_4_BIT) >> 2,0);
  pVVar1 = Context::getDeviceProperties(_flags_local);
  if ((pVVar1->limits).strictLines == 0) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Strict rasterization is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xa1c);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    range._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->m_lineWidths,(long)this->m_iterationCount,(value_type_conflict3 *)&range);
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    pVVar3 = Context::getDeviceFeatures
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    if (pVVar3->wideLines == 0) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0xa26);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pVVar1 = Context::getDeviceProperties(_flags_local);
    local_40 = (pVVar1->limits).lineWidthRange;
    this_00 = Context::getTestContext
                        ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [29])"ALIASED_LINE_WIDTH_RANGE = [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_40);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x136aa81);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_40 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x131325b);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    if (local_40[1] <= 1.0) {
      local_1e2 = 1;
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"wide line support required",&local_1e1);
      tcu::NotSupportedError::NotSupportedError(pNVar2,&local_1e0);
      local_1e2 = 0;
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    local_1e8 = 5.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,&local_1e8);
    local_1ec = 10.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,&local_1ec);
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,local_40 + 1);
    this->m_maxLineWidth = local_40[1];
  }
  return;
}

Assistant:

LineInterpolationTestInstance::LineInterpolationTestInstance (Context& context, VkPrimitiveTopology primitiveTopology, int flags, PrimitiveWideness wideness, VkSampleCountFlagBits sampleCount)
	: BaseRenderingTestInstance			(context, sampleCount)
	, m_primitiveTopology				(primitiveTopology)
	, m_projective						((flags & INTERPOLATIONFLAGS_PROJECTED) != 0)
	, m_iterationCount					(3)
	, m_primitiveWideness				(wideness)
	, m_iteration						(0)
	, m_allIterationsPassed				(true)
	, m_maxLineWidth					(1.0f)
	, m_flatshade						((flags & INTERPOLATIONFLAGS_FLATSHADE) != 0)
{
	DE_ASSERT(m_primitiveWideness < PRIMITIVEWIDENESS_LAST);

	if (!context.getDeviceProperties().limits.strictLines)
		TCU_THROW(NotSupportedError, "Strict rasterization is not supported");

	// create line widths
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_lineWidths.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		if (!m_context.getDeviceFeatures().wideLines)
			TCU_THROW(NotSupportedError , "wide line support required");

		const float*	range = context.getDeviceProperties().limits.lineWidthRange;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			throw tcu::NotSupportedError("wide line support required");

		// set hand picked sizes
		m_lineWidths.push_back(5.0f);
		m_lineWidths.push_back(10.0f);
		m_lineWidths.push_back(range[1]);
		DE_ASSERT((int)m_lineWidths.size() == m_iterationCount);

		m_maxLineWidth = range[1];
	}
	else
		DE_ASSERT(false);
}